

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcscan.c
# Opt level: O2

int gcscan1(int probe)

{
  uint uVar1;
  uint uVar2;
  
  do {
    uVar2 = probe;
    if ((int)uVar2 < 1) {
      return -1;
    }
    probe = uVar2 - 1;
    uVar1 = HTmain[(uint)probe];
  } while ((uVar1 == 0) || ((0xffff < uVar1 && ((uVar1 & 1) == 0))));
  return uVar2 - 1;
}

Assistant:

int gcscan1(int probe)
/* probe is offset */
{
  struct htlinkptr *htlptr; /* overlay access method */
  int contents;
  while (--probe >= 0) /* End of HTmain Table ? */
  {
    /* Start addr. of scanning */
    htlptr = (struct htlinkptr *)(HTmain + probe);
    contents = ((struct htlinkptr *)GCPTR(htlptr))->contents;
    if (contents && (((struct hashentry *)GCPTR(HTENDS))->collision || (GetStkCnt(contents) == 0)))
      return (probe);
  }
  return (-1);
}